

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setTargetNamespace
          (XMLSchemaDescriptionImpl *this,XMLCh *newNamespace)

{
  XMLCh *pXVar1;
  
  if (this->fNamespace != (XMLCh *)0x0) {
    (*((this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr)->_vptr_MemoryManager
      [4])();
    this->fNamespace = (XMLCh *)0x0;
  }
  pXVar1 = XMLString::replicate
                     (newNamespace,
                      (this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr);
  this->fNamespace = pXVar1;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setTargetNamespace(const XMLCh* const newNamespace)
{  
    if (fNamespace) {
        XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);
        fNamespace = 0;
    }
    
    fNamespace = XMLString::replicate(newNamespace, XMLGrammarDescription::getMemoryManager()); 
}